

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O1

bool slang::syntax::SyntaxFacts::isGateType(TokenKind kind)

{
  int iVar1;
  undefined6 in_register_0000003a;
  
  iVar1 = (int)CONCAT62(in_register_0000003a,kind);
  if ((((0x31 < iVar1 - 0xdaU) || ((0x3e0080c021761U >> ((ulong)(iVar1 - 0xdaU) & 0x3f) & 1) == 0))
      && ((0x18 < iVar1 - 99U || ((0x1007001U >> (iVar1 - 99U & 0x1f) & 1) == 0)))) &&
     ((0x25 < iVar1 - 0x12fU || ((0x3000000007U >> ((ulong)(iVar1 - 0x12fU) & 0x3f) & 1) == 0)))) {
    return false;
  }
  return true;
}

Assistant:

bool SyntaxFacts::isGateType(TokenKind kind) {
    switch (kind) {
        case TokenKind::CmosKeyword:
        case TokenKind::RcmosKeyword:
        case TokenKind::NmosKeyword:
        case TokenKind::PmosKeyword:
        case TokenKind::RnmosKeyword:
        case TokenKind::RpmosKeyword:
        case TokenKind::BufIf0Keyword:
        case TokenKind::BufIf1Keyword:
        case TokenKind::NotIf0Keyword:
        case TokenKind::NotIf1Keyword:
        case TokenKind::AndKeyword:
        case TokenKind::NandKeyword:
        case TokenKind::OrKeyword:
        case TokenKind::NorKeyword:
        case TokenKind::XorKeyword:
        case TokenKind::XnorKeyword:
        case TokenKind::BufKeyword:
        case TokenKind::NotKeyword:
        case TokenKind::TranIf0Keyword:
        case TokenKind::TranIf1Keyword:
        case TokenKind::RtranIf0Keyword:
        case TokenKind::RtranIf1Keyword:
        case TokenKind::TranKeyword:
        case TokenKind::RtranKeyword:
        case TokenKind::PullDownKeyword:
        case TokenKind::PullUpKeyword:
            return true;
        default:
            return false;
    }
}